

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

bool tinyxml2::XMLUtil::IsNameStartChar(uchar ch)

{
  int iVar1;
  bool local_b;
  bool local_9;
  uchar ch_local;
  
  if (ch < 0x80) {
    iVar1 = isalpha((uint)ch);
    if (iVar1 == 0) {
      local_b = ch == ':' || ch == '_';
      local_9 = local_b;
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

inline static bool IsNameStartChar(unsigned char ch)
    {
        if (ch >= 128) {
            // This is a heuristic guess in attempt to not implement Unicode-aware isalpha()
            return true;
        }
        if (isalpha(ch)) {
            return true;
        }
        return ch == ':' || ch == '_';
    }